

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O0

bool compare_4cc(char *in,string *in_4cc)

{
  char cVar1;
  char *pcVar2;
  string *in_4cc_local;
  char *in_local;
  
  cVar1 = *in;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_4cc);
  if ((((cVar1 == *pcVar2) &&
       (cVar1 = in[1], pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_4cc),
       cVar1 == *pcVar2)) &&
      (cVar1 = in[2], pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_4cc),
      cVar1 == *pcVar2)) &&
     (cVar1 = in[3], pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_4cc),
     cVar1 == *pcVar2)) {
    return true;
  }
  return false;
}

Assistant:

bool compare_4cc(char *in, std::string in_4cc)
{
	if (in[0] == in_4cc[0] && in[1] == in_4cc[1] && in[2] == in_4cc[2] && in[3] == in_4cc[3])
		return true;
	else
		return false;
}